

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_add op;
  int local_344;
  int local_2c8;
  undefined8 *local_2b8;
  float *local_2b0;
  undefined8 *local_2a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  local_2a8 = in_RDI;
  if (in_R8D == 8) {
    for (local_2c8 = 0; local_2c8 < in_ECX; local_2c8 = local_2c8 + 1) {
      fVar1 = *local_2b0;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      local_180 = (float)*local_2a8;
      fStack_17c = (float)((ulong)*local_2a8 >> 0x20);
      fStack_178 = (float)local_2a8[1];
      fStack_174 = (float)((ulong)local_2a8[1] >> 0x20);
      fStack_170 = (float)local_2a8[2];
      fStack_16c = (float)((ulong)local_2a8[2] >> 0x20);
      fStack_168 = (float)local_2a8[3];
      fStack_164 = (float)((ulong)local_2a8[3] >> 0x20);
      local_1a0 = auVar4._0_4_;
      fStack_19c = auVar4._4_4_;
      fStack_198 = auVar4._8_4_;
      fStack_194 = auVar4._12_4_;
      fStack_190 = auVar3._0_4_;
      fStack_18c = auVar3._4_4_;
      fStack_188 = auVar3._8_4_;
      fStack_184 = auVar3._12_4_;
      *local_2b8 = CONCAT44(fStack_17c + fStack_19c,local_180 + local_1a0);
      local_2b8[1] = CONCAT44(fStack_174 + fStack_194,fStack_178 + fStack_198);
      local_2b8[2] = CONCAT44(fStack_16c + fStack_18c,fStack_170 + fStack_190);
      local_2b8[3] = CONCAT44(fStack_164 + fStack_184,fStack_168 + fStack_188);
      local_2a8 = local_2a8 + 4;
      local_2b0 = local_2b0 + 1;
      local_2b8 = local_2b8 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_344 = 0; local_344 + 1 < in_ECX; local_344 = local_344 + 2) {
      fVar1 = *local_2b0;
      fVar2 = local_2b0[1];
      local_140 = (float)*local_2a8;
      fStack_13c = (float)((ulong)*local_2a8 >> 0x20);
      fStack_138 = (float)local_2a8[1];
      fStack_134 = (float)((ulong)local_2a8[1] >> 0x20);
      fStack_130 = (float)local_2a8[2];
      fStack_12c = (float)((ulong)local_2a8[2] >> 0x20);
      fStack_128 = (float)local_2a8[3];
      fStack_124 = (float)((ulong)local_2a8[3] >> 0x20);
      *local_2b8 = CONCAT44(fStack_13c + fVar1,local_140 + fVar1);
      local_2b8[1] = CONCAT44(fStack_134 + fVar1,fStack_138 + fVar1);
      local_2b8[2] = CONCAT44(fStack_12c + fVar2,fStack_130 + fVar2);
      local_2b8[3] = CONCAT44(fStack_124 + fVar2,fStack_128 + fVar2);
      local_2a8 = local_2a8 + 4;
      local_2b0 = local_2b0 + 2;
      local_2b8 = local_2b8 + 4;
    }
    for (; local_344 < in_ECX; local_344 = local_344 + 1) {
      fVar1 = *local_2b0;
      local_110 = (float)*local_2a8;
      fStack_10c = (float)((ulong)*local_2a8 >> 0x20);
      fStack_108 = (float)local_2a8[1];
      fStack_104 = (float)((ulong)local_2a8[1] >> 0x20);
      *local_2b8 = CONCAT44(fStack_10c + fVar1,local_110 + fVar1);
      local_2b8[1] = CONCAT44(fStack_104 + fVar1,fStack_108 + fVar1);
      local_2a8 = local_2a8 + 2;
      local_2b0 = local_2b0 + 1;
      local_2b8 = local_2b8 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}